

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O3

void __thiscall
Centaurus::LookaheadDFA<unsigned_char>::LookaheadDFA
          (LookaheadDFA<unsigned_char> *this,CompositeATN<unsigned_char> *catn,ATNPath *origin,
          bool optimize_flag)

{
  NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
  *pNVar1;
  vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
  *__range2;
  LDFAState<unsigned_char> *state;
  NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
  *this_00;
  _Rb_tree<Centaurus::CATNClosureElement,_Centaurus::CATNClosureElement,_std::_Identity<Centaurus::CATNClosureElement>,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
  _Stack_58;
  
  (this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
  super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
  super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
  super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFABase_0019ceb0;
  CompositeATN<unsigned_char>::build_root_closure((CATNClosure *)&_Stack_58,catn,origin);
  std::
  vector<Centaurus::LDFAState<unsigned_char>,std::allocator<Centaurus::LDFAState<unsigned_char>>>::
  emplace_back<std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>
            ((vector<Centaurus::LDFAState<unsigned_char>,std::allocator<Centaurus::LDFAState<unsigned_char>>>
              *)&(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states,
             (set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
              *)&_Stack_58);
  std::
  _Rb_tree<Centaurus::CATNClosureElement,_Centaurus::CATNClosureElement,_std::_Identity<Centaurus::CATNClosureElement>,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
  ::~_Rb_tree(&_Stack_58);
  fork_closures(this,catn,0);
  pNVar1 = &((this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super_NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
  ;
  for (this_00 = &((this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                   super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super_NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
      ; this_00 != pNVar1; this_00 = this_00 + 1) {
    NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
    ::sort(this_00);
  }
  if (optimize_flag) {
    minimize(this);
  }
  return;
}

Assistant:

LookaheadDFA(const CompositeATN<TCHAR>& catn, const ATNPath& origin, bool optimize_flag = true)
	{
		m_states.emplace_back(catn.build_root_closure(origin));

		fork_closures(catn, 0);

        for (auto& state : m_states)
            state.sort();

        if (optimize_flag)
            minimize();
	}